

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckFailureIncludesCheckContents::
~TestCheckFailureIncludesCheckContents(TestCheckFailureIncludesCheckContents *this)

{
  TestCheckFailureIncludesCheckContents *this_local;
  
  ~TestCheckFailureIncludesCheckContents(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckFailureIncludesCheckContents)
{
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        const bool yaddayadda = false;
        CHECK(yaddayadda);
    }

    CHECK(strstr(reporter.lastFailedMessage, "yaddayadda"));
}